

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

short __thiscall
duckdb::Interpolator<false>::Interpolate<unsigned_long,short,duckdb::QuantileIndirect<short>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<short> *accessor)

{
  short sVar1;
  CURSOR *pCVar2;
  bool bVar3;
  reference pvVar4;
  ulong uVar5;
  int iVar6;
  unkbyte10 Var7;
  short result_1;
  short local_52;
  string local_50;
  
  pCVar2 = accessor->data;
  uVar5 = (pCVar2->scan).current_row_index;
  bVar3 = (pCVar2->scan).next_row_index <= lidx;
  if (lidx == hidx) {
    if (lidx < uVar5 || bVar3) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar2->inputs,(ColumnDataScanState *)lidx,(DataChunk *)&pCVar2->scan);
      pvVar4 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      pCVar2->data = *(short **)(pvVar4 + 0x20);
      pvVar4 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      FlatVector::VerifyFlatVector(pvVar4);
      pCVar2->validity = (ValidityMask *)(pvVar4 + 0x28);
      uVar5 = (pCVar2->scan).current_row_index;
    }
    sVar1 = pCVar2->data[(uint)((int)lidx - (int)uVar5)];
    bVar3 = duckdb::TryCast::Operation<short,short>(sVar1,&local_52,false);
    if (!bVar3) {
      Var7 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_50,(duckdb *)(ulong)(uint)(int)sVar1,(short)((unkuint10)Var7 >> 0x40));
      duckdb::InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var7,(string *)&local_50);
      __cxa_throw((InvalidInputException *)Var7,&InvalidInputException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
  }
  else {
    if (lidx < uVar5 || bVar3) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar2->inputs,(ColumnDataScanState *)lidx,(DataChunk *)&pCVar2->scan);
      pvVar4 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      pCVar2->data = *(short **)(pvVar4 + 0x20);
      pvVar4 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      FlatVector::VerifyFlatVector(pvVar4);
      pCVar2->validity = (ValidityMask *)(pvVar4 + 0x28);
      uVar5 = (pCVar2->scan).current_row_index;
    }
    sVar1 = pCVar2->data[(uint)((int)lidx - (int)uVar5)];
    bVar3 = duckdb::TryCast::Operation<short,short>(sVar1,&local_52,false);
    if (!bVar3) {
      Var7 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_50,(duckdb *)(ulong)(uint)(int)sVar1,(short)((unkuint10)Var7 >> 0x40));
      duckdb::InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var7,(string *)&local_50);
      __cxa_throw((InvalidInputException *)Var7,&InvalidInputException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
    iVar6 = (int)local_52;
    pCVar2 = accessor->data;
    uVar5 = (pCVar2->scan).current_row_index;
    if ((pCVar2->scan).next_row_index <= hidx || hidx < uVar5) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar2->inputs,(ColumnDataScanState *)hidx,(DataChunk *)&pCVar2->scan);
      pvVar4 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      pCVar2->data = *(short **)(pvVar4 + 0x20);
      pvVar4 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
      FlatVector::VerifyFlatVector(pvVar4);
      pCVar2->validity = (ValidityMask *)(pvVar4 + 0x28);
      uVar5 = (pCVar2->scan).current_row_index;
    }
    sVar1 = pCVar2->data[(uint)((int)hidx - (int)uVar5)];
    bVar3 = duckdb::TryCast::Operation<short,short>(sVar1,&local_52,false);
    if (!bVar3) {
      Var7 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_50,(duckdb *)(ulong)(uint)(int)sVar1,(short)((unkuint10)Var7 >> 0x40));
      duckdb::InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var7,(string *)&local_50);
      __cxa_throw((InvalidInputException *)Var7,&InvalidInputException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
    local_52 = (short)(int)((double)(local_52 - iVar6) *
                            (this->RN -
                            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                             1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                           (double)iVar6);
  }
  return local_52;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}